

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

void __thiscall Diligent::PipelineStateGLImpl::Destruct(PipelineStateGLImpl *this)

{
  RenderDeviceGLImpl *this_00;
  long lVar1;
  Uint32 i;
  ulong uVar2;
  
  this_00 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
            ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                         *)this);
  RenderDeviceGLImpl::OnDestroyPSO(this_00,this);
  if (this->m_GLPrograms != (SharedGLProgramPtr *)0x0) {
    lVar1 = 8;
    for (uVar2 = 0; uVar2 < this->m_NumPrograms; uVar2 = uVar2 + 1) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(this->m_GLPrograms->
                         super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 + lVar1));
      lVar1 = lVar1 + 0x10;
    }
    this->m_GLPrograms = (SharedGLProgramPtr *)0x0;
  }
  this->m_ShaderTypes = (SHADER_TYPE *)0x0;
  this->m_NumPrograms = '\0';
  PipelineStateBase<Diligent::EngineGLImplTraits>::Destruct
            (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  return;
}

Assistant:

void PipelineStateGLImpl::Destruct()
{
    GetDevice()->OnDestroyPSO(*this);

    if (m_GLPrograms)
    {
        for (Uint32 i = 0; i < m_NumPrograms; ++i)
        {
            m_GLPrograms[i].~SharedGLProgramPtr();
        }
        m_GLPrograms = nullptr;
    }

    m_ShaderTypes = nullptr;
    m_NumPrograms = 0;

    TPipelineStateBase::Destruct();
}